

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateCopyFrom
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *file;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  file = Descriptor::file(this->descriptor_);
  bVar1 = HasDescriptorMethods(file);
  if (bVar1) {
    io::Printer::Print(printer,
                       "void $classname$::CopyFrom(const ::google::protobuf::Message& from) {\n",
                       "classname",&this->classname_);
    io::Printer::Indent(printer);
    io::Printer::Print(printer,"if (&from == this) return;\nClear();\nMergeFrom(from);\n");
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
  }
  io::Printer::Print(printer,"void $classname$::CopyFrom(const $classname$& from) {\n","classname",
                     &this->classname_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"if (&from == this) return;\nClear();\nMergeFrom(from);\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateCopyFrom(io::Printer* printer) {
  if (HasDescriptorMethods(descriptor_->file())) {
    // Generate the generalized CopyFrom (aka that which takes in the Message
    // base class as a parameter).
    printer->Print(
      "void $classname$::CopyFrom(const ::google::protobuf::Message& from) {\n",
      "classname", classname_);
    printer->Indent();

    printer->Print(
      "if (&from == this) return;\n"
      "Clear();\n"
      "MergeFrom(from);\n");

    printer->Outdent();
    printer->Print("}\n\n");
  }

  // Generate the class-specific CopyFrom.
  printer->Print(
    "void $classname$::CopyFrom(const $classname$& from) {\n",
    "classname", classname_);
  printer->Indent();

  printer->Print(
    "if (&from == this) return;\n"
    "Clear();\n"
    "MergeFrom(from);\n");

  printer->Outdent();
  printer->Print("}\n");
}